

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O3

bool __thiscall
rtosc::UndoHistoryImpl::mergeEvent(UndoHistoryImpl *this,time_t now,char *msg,char *buf,size_t N)

{
  int iVar1;
  ulong uVar2;
  _Elt_pointer ppVar3;
  char *arguments;
  _Elt_pointer ppVar4;
  _Map_pointer pppVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  rtosc_arg_t rVar10;
  rtosc_arg_t rVar11;
  rtosc_arg_t local_68;
  rtosc_arg_t local_58;
  rtosc_arg_t local_48;
  
  if (this->history_pos == 0) {
    return false;
  }
  uVar8 = this->history_pos & 0xffffffff;
  do {
    uVar8 = uVar8 - 1;
    if ((int)(uint)uVar8 < 0) {
      return false;
    }
    uVar7 = (ulong)((uint)uVar8 & 0x7fffffff);
    ppVar3 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar2 = ((long)ppVar3 -
             (long)(this->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
    if ((long)uVar2 < 0) {
      uVar6 = (long)uVar2 >> 5;
LAB_00111153:
      ppVar3 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] + uVar2 + uVar6 * -0x20;
    }
    else {
      if (0x1f < uVar2) {
        uVar6 = uVar2 >> 5;
        goto LAB_00111153;
      }
      ppVar3 = ppVar3 + uVar7;
    }
    dVar9 = difftime(now,ppVar3->first);
    if (2.0 < dVar9) {
      return false;
    }
    rVar10 = rtosc_argument(msg,0);
    ppVar3 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar2 = ((long)ppVar3 -
             (long)(this->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
    if ((long)uVar2 < 0) {
      uVar6 = (long)uVar2 >> 5;
LAB_001111c8:
      ppVar3 = (this->history).
               super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_node[uVar6] + uVar2 + uVar6 * -0x20;
    }
    else {
      if (0x1f < uVar2) {
        uVar6 = uVar2 >> 5;
        goto LAB_001111c8;
      }
      ppVar3 = ppVar3 + uVar7;
    }
    rVar11 = rtosc_argument(ppVar3->second,0);
    iVar1 = strcmp(rVar10.s,rVar11.s);
  } while (iVar1 != 0);
  local_68 = rtosc_argument(msg,0);
  ppVar3 = (this->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  uVar8 = ((long)ppVar3 -
           (long)(this->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
  if ((long)uVar8 < 0) {
    uVar2 = (long)uVar8 >> 5;
LAB_0011125e:
    ppVar3 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_node[uVar2] + uVar8 + uVar2 * -0x20;
  }
  else {
    if (0x1f < uVar8) {
      uVar2 = uVar8 >> 5;
      goto LAB_0011125e;
    }
    ppVar3 = ppVar3 + uVar7;
  }
  local_58 = rtosc_argument(ppVar3->second,1);
  local_48 = rtosc_argument(msg,2);
  arguments = rtosc_argument_string(msg);
  rtosc_amessage(buf,N,msg,arguments,&local_68);
  ppVar3 = (this->history).
           super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pppVar5 = (this->history).
            super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  uVar8 = ((long)ppVar3 -
           (long)(this->history).
                 super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
  if ((long)uVar8 < 0) {
    uVar2 = (long)uVar8 >> 5;
LAB_001112f8:
    ppVar4 = pppVar5[uVar2] + uVar8 + uVar2 * -0x20;
  }
  else {
    if (0x1f < uVar8) {
      uVar2 = uVar8 >> 5;
      goto LAB_001112f8;
    }
    ppVar4 = ppVar3 + uVar7;
  }
  if (ppVar4->second != (char *)0x0) {
    operator_delete__(ppVar4->second);
    ppVar3 = (this->history).
             super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pppVar5 = (this->history).
              super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    uVar8 = ((long)ppVar3 -
             (long)(this->history).
                   super__Deque_base<std::pair<long,_const_char_*>,_std::allocator<std::pair<long,_const_char_*>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_first >> 4) + uVar7;
  }
  if ((long)uVar8 < 0) {
    uVar2 = (long)uVar8 >> 5;
  }
  else {
    if (uVar8 < 0x20) {
      ppVar4 = ppVar3 + uVar7;
      ppVar3[uVar7].second = buf;
      goto LAB_0011137e;
    }
    uVar2 = uVar8 >> 5;
  }
  *(char **)((long)&pppVar5[uVar2]->second + (ulong)(((uint)uVar8 & 0x1f) << 4)) = buf;
  ppVar4 = pppVar5[uVar2] + uVar8 + uVar2 * -0x20;
LAB_0011137e:
  ppVar4->first = now;
  return true;
}

Assistant:

bool UndoHistoryImpl::mergeEvent(time_t now, const char *msg, char *buf, size_t N)
{
    if(history_pos == 0)
        return false;
    for(int i=history_pos-1; i>=0; --i) {
        if(difftime(now, history[i].first) > 2)
            break;
        if(!strcmp(getUndoAddress(msg),
                    getUndoAddress(history[i].second)))
        {
            //We can splice events together, merging them into one event
            rtosc_arg_t args[3];
            args[0] = rtosc_argument(msg, 0);
            args[1] = rtosc_argument(history[i].second,1);
            args[2] = rtosc_argument(msg, 2);

            rtosc_amessage(buf, N, msg, rtosc_argument_string(msg), args);

            delete [] history[i].second;
            history[i].second = buf;
            history[i].first = now;
            return true;
        }
    }
    return false;
}